

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
CompileLanguageNode::Evaluate
          (string *__return_storage_ptr__,CompileLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  const_iterator __begin1;
  pointer pbVar6;
  bool bVar7;
  string genName;
  string local_90;
  string local_70;
  string local_50;
  
  if (((context->Language)._M_string_length == 0) &&
     ((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0 ||
      (bVar7 = cmGeneratorExpressionDAGChecker::EvaluatingCompileExpression(dagChecker), !bVar7))))
  {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_90,content);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "$<COMPILE_LANGUAGE:...> may only be used to specify include directories, compile definitions, compile options, and to evaluate components of the file(GENERATE) command."
               ,"");
    reportError(context,&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  (*context->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_90);
  lVar5 = std::__cxx11::string::find((char *)&local_90,0x972bf3,0);
  if ((((lVar5 == -1) &&
       (lVar5 = std::__cxx11::string::find((char *)&local_90,0x91fb13,0), lVar5 == -1)) &&
      (lVar5 = std::__cxx11::string::find((char *)&local_90,0x940002,0), lVar5 == -1)) &&
     (((lVar5 = std::__cxx11::string::find((char *)&local_90,0x96d6ff,0), lVar5 == -1 &&
       (lVar5 = std::__cxx11::string::find((char *)&local_90,0x94bd7d,0), lVar5 == -1)) &&
      (lVar5 = std::__cxx11::string::find((char *)&local_90,0x94bd58,0), lVar5 == -1)))) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_70,content);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"$<COMPILE_LANGUAGE:...> not supported for this generator.","");
    reportError(context,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pbVar6 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    paVar1 = &__return_storage_ptr__->field_2;
    if (pbVar6 == pbVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      pcVar3 = (context->Language)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,
                 pcVar3 + (context->Language)._M_string_length);
    }
    else {
      do {
        __n = (context->Language)._M_string_length;
        if (__n == pbVar6->_M_string_length) {
          if (__n == 0) {
            bVar7 = true;
          }
          else {
            iVar4 = bcmp((context->Language)._M_dataplus._M_p,(pbVar6->_M_dataplus)._M_p,__n);
            bVar7 = iVar4 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1","");
          if (bVar7) goto LAB_005e90aa;
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar2);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
    }
  }
LAB_005e90aa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (context->Language.empty() &&
        (!dagChecker || !dagChecker->EvaluatingCompileExpression())) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<COMPILE_LANGUAGE:...> may only be used to specify include "
        "directories, compile definitions, compile options, and to evaluate "
        "components of the file(GENERATE) command.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos &&
        genName.find("Green Hills MULTI") == std::string::npos) {
      reportError(context, content->GetOriginalExpression(),
                  "$<COMPILE_LANGUAGE:...> not supported for this generator.");
      return std::string();
    }
    if (parameters.empty()) {
      return context->Language;
    }

    for (auto const& param : parameters) {
      if (context->Language == param) {
        return "1";
      }
    }
    return "0";
  }